

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O1

int X509V3_EXT_REQ_add_nconf(CONF *conf,X509V3_CTX *ctx,char *section,X509_REQ *req)

{
  int iVar1;
  OPENSSL_STACK **sk;
  stack_st_X509_EXTENSION *extlist;
  OPENSSL_STACK *local_20;
  
  sk = &local_20;
  local_20 = (OPENSSL_STACK *)0x0;
  if (req == (X509_REQ *)0x0) {
    sk = (OPENSSL_STACK **)0x0;
  }
  iVar1 = X509V3_EXT_add_nconf_sk(conf,ctx,section,(stack_st_X509_EXTENSION **)sk);
  if (iVar1 != 0 && req != (X509_REQ *)0x0) {
    iVar1 = X509_REQ_add_extensions(req,(stack_st_X509_EXTENSION *)local_20);
    OPENSSL_sk_pop_free_ex(local_20,sk_X509_EXTENSION_call_free_func,X509_EXTENSION_free);
  }
  return iVar1;
}

Assistant:

int X509V3_EXT_REQ_add_nconf(const CONF *conf, const X509V3_CTX *ctx,
                             const char *section, X509_REQ *req) {
  STACK_OF(X509_EXTENSION) *extlist = NULL, **sk = NULL;
  int i;
  if (req) {
    sk = &extlist;
  }
  i = X509V3_EXT_add_nconf_sk(conf, ctx, section, sk);
  if (!i || !sk) {
    return i;
  }
  i = X509_REQ_add_extensions(req, extlist);
  sk_X509_EXTENSION_pop_free(extlist, X509_EXTENSION_free);
  return i;
}